

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condensation.cpp
# Opt level: O1

Clause * __thiscall Inferences::Condensation::simplify(Condensation *this,Clause *cl)

{
  long *plVar1;
  List<Kernel::Literal_*> *pLVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Literal *pLVar10;
  List<Kernel::Literal_*> *pLVar11;
  ulong uVar12;
  Literal **ppLVar13;
  List<Kernel::Literal_*> **ppLVar14;
  uint uVar15;
  void **head;
  Entry *pEVar16;
  Clause *pCVar17;
  uint i;
  uint baseLen;
  uint uVar18;
  uint uVar19;
  Literal **res;
  ulong uVar20;
  SubstIterator sit;
  InstanceIterator iit;
  LiteralMiniIndex cmi;
  RobSubstitution subst0;
  undefined1 local_1b8 [40];
  IteratorBase local_190;
  Entry *local_170;
  Clause *local_168;
  Entry *local_160;
  Entry *local_158;
  Entry *local_150;
  LiteralMiniIndex local_148;
  Inference local_128;
  RobSubstitution local_f8;
  
  uVar15 = *(uint *)&cl->field_0x38 & 0xfffff;
  pCVar17 = cl;
  if (1 < uVar15) {
    if ((simplify(Kernel::Clause*)::newLits == '\0') &&
       (iVar9 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::newLits), iVar9 != 0)) {
      simplify::newLits._size = 0x20;
      simplify::newLits._capacity = 0x20;
      ppLVar13 = (Literal **)::operator_new(0x100,0x10);
      if (simplify::newLits._capacity != 0) {
        memset(ppLVar13,0,simplify::newLits._capacity << 3);
      }
      simplify::newLits._array = ppLVar13;
      __cxa_atexit(::Lib::DArray<Kernel::Literal_*>::~DArray,&simplify::newLits,&__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::newLits);
    }
    if ((simplify(Kernel::Clause*)::alts == '\0') &&
       (iVar9 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::alts), iVar9 != 0)) {
      simplify::alts._size = 0x20;
      simplify::alts._capacity = 0x20;
      ppLVar14 = (List<Kernel::Literal_*> **)::operator_new(0x100,0x10);
      if (simplify::alts._capacity != 0) {
        memset(ppLVar14,0,simplify::alts._capacity << 3);
      }
      simplify::alts._array = ppLVar14;
      __cxa_atexit(::Lib::DArray<Lib::List<Kernel::Literal_*>_*>::~DArray,&simplify::alts,
                   &__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::alts);
    }
    baseLen = uVar15 - 1;
    Indexing::LiteralMiniIndex::LiteralMiniIndex(&local_148,cl);
    local_160 = (Entry *)(ulong)(uVar15 + (uVar15 == 0));
    uVar12 = (ulong)baseLen;
    pEVar16 = (Entry *)0x0;
    uVar19 = 1;
    local_1b8._32_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18;
    do {
      uVar8 = uVar19 + 1;
      uVar3 = (uint)pEVar16;
      uVar4 = uVar3 + 2;
      if (uVar8 != uVar15) {
        uVar4 = uVar8;
      }
      uVar18 = 0;
      local_170 = pEVar16;
      if (uVar3 != uVar19) {
        local_1b8._16_8_ = cl->_literals[(int)uVar3];
        pLVar10 = cl->_literals[(int)uVar19];
        local_1b8._12_4_ = uVar4;
        ::Lib::DArray<Kernel::Literal_*>::ensure(&simplify::newLits,uVar12);
        Kernel::RobSubstitution::RobSubstitution(&local_f8);
        Kernel::RobSubstitution::unifiers
                  ((RobSubstitution *)local_1b8,(Literal *)&local_f8,(int)local_1b8._16_8_,
                   (Literal *)0x0,(int)pLVar10,false);
        local_150 = (Entry *)(ulong)uVar19;
        local_158 = pEVar16;
        do {
          cVar5 = (**(code **)(*(long *)local_1b8._0_8_ + 0x10))();
          if (cVar5 == '\0') {
            uVar18 = 0;
            break;
          }
          local_1b8._24_8_ = (**(code **)(*(long *)local_1b8._0_8_ + 0x18))();
          ::Lib::DArray<Lib::List<Kernel::Literal_*>_*>::ensure(&simplify::alts,uVar12);
          if (baseLen != 0) {
            ppLVar14 = simplify::alts._array + uVar12;
            do {
              ppLVar14[-1] = (List<Kernel::Literal_*> *)0x0;
              ppLVar14 = ppLVar14 + -1;
            } while (ppLVar14 != simplify::alts._array);
          }
          pLVar10 = Kernel::RobSubstitution::apply
                              ((RobSubstitution *)local_1b8._24_8_,(Literal *)local_1b8._16_8_,0);
          *simplify::newLits._array = pLVar10;
          Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                    (&local_190,&local_148,pLVar10,false);
          bVar6 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                            ((InstanceIterator *)&local_190);
          if (bVar6) {
            while (bVar6 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                     ((InstanceIterator *)&local_190),
                  ppLVar14 = simplify::alts._array, bVar6) {
              local_190._ready = false;
              pLVar10 = (Literal *)(((VarSpec *)&(local_190._curr)->_lit)->_self)._content;
              pLVar2 = *simplify::alts._array;
              local_190._curr = (Entry *)&((VarSpec *)&(local_190._curr)->_lit)->index;
              pLVar11 = (List<Kernel::Literal_*> *)
                        ::Lib::FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)local_1b8._32_8_);
              pLVar11->_head = pLVar10;
              pLVar11->_tail = pLVar2;
              *ppLVar14 = pLVar11;
            }
            uVar18 = 0;
            uVar20 = 1;
          }
          else {
            uVar18 = 6;
            uVar20 = 0;
          }
          if (uVar18 == 6) {
LAB_004cc873:
            bVar6 = false;
LAB_004cc87f:
            if (baseLen != 0) {
              uVar20 = 0;
              do {
                pLVar2 = simplify::alts._array[uVar20];
                while (pLVar11 = pLVar2, pLVar11 != (List<Kernel::Literal_*> *)0x0) {
                  pLVar2 = pLVar11->_tail;
                  if (pLVar11 != (List<Kernel::Literal_*> *)0x0) {
                    pLVar11->_head = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
                    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar11;
                  }
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar12);
            }
            uVar18 = 0;
            if (bVar6 != false) {
              *(int *)(DAT_00b7e1c0 + 0x16c) = *(int *)(DAT_00b7e1c0 + 0x16c) + 1;
              ppLVar13 = simplify::newLits._array;
              local_190._ready = true;
              local_190._query = (Literal *)cl;
              Kernel::Inference::Inference(&local_128,(SimplifyingInference1 *)&local_190);
              local_168 = Kernel::Clause::fromArray(ppLVar13,baseLen,&local_128);
              uVar18 = 1;
            }
          }
          else if (uVar18 == 0) {
            pEVar16 = (Entry *)0x0;
            do {
              if (pEVar16 != local_150 && pEVar16 != local_158) {
                pLVar10 = Kernel::RobSubstitution::apply
                                    ((RobSubstitution *)local_1b8._24_8_,
                                     cl->_literals[(long)pEVar16],0);
                uVar19 = (uint)uVar20;
                simplify::newLits._array[uVar20] = pLVar10;
                Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                          (&local_190,&local_148,pLVar10,false);
                bVar6 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                  ((InstanceIterator *)&local_190);
                uVar18 = 6;
                if (bVar6) {
                  while (bVar7 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                           ((InstanceIterator *)&local_190),
                        ppLVar14 = simplify::alts._array, bVar7) {
                    local_190._ready = false;
                    pLVar10 = (Literal *)(((VarSpec *)&(local_190._curr)->_lit)->_self)._content;
                    pLVar2 = simplify::alts._array[uVar20];
                    local_190._curr = (Entry *)&((VarSpec *)&(local_190._curr)->_lit)->index;
                    pLVar11 = (List<Kernel::Literal_*> *)
                              ::Lib::FixedSizeAllocator<16UL>::alloc
                                        ((FixedSizeAllocator<16UL> *)local_1b8._32_8_);
                    pLVar11->_head = pLVar10;
                    pLVar11->_tail = pLVar2;
                    ppLVar14[uVar20] = pLVar11;
                  }
                  uVar19 = uVar19 + 1;
                  uVar18 = 0;
                }
                uVar20 = (ulong)uVar19;
                if (!bVar6) goto LAB_004cc827;
              }
              pEVar16 = (Entry *)((long)&pEVar16->field_0 + 1);
            } while (pEVar16 != local_160);
            uVar18 = 9;
LAB_004cc827:
            if (uVar18 == 6) goto LAB_004cc873;
            if (uVar18 != 9) goto LAB_004cc916;
            bVar6 = Kernel::MLMatcher::canBeMatched
                              (simplify::newLits._array,baseLen,cl,simplify::alts._array,
                               (Literal *)0x0,false);
            goto LAB_004cc87f;
          }
LAB_004cc916:
        } while (uVar18 == 0);
        if ((long *)local_1b8._0_8_ != (long *)0x0) {
          plVar1 = (long *)(local_1b8._0_8_ + 8);
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*(long *)local_1b8._0_8_ + 8))();
          }
        }
        Kernel::RobSubstitution::~RobSubstitution(&local_f8);
        uVar4 = local_1b8._12_4_;
      }
      uVar19 = uVar4;
      pCVar17 = local_168;
    } while (((uVar18 & 0xd) == 0) &&
            (pEVar16 = (Entry *)(ulong)((int)local_170 + (uint)(uVar8 == uVar15)), pCVar17 = cl,
            uVar19 != uVar15));
    if (local_148._entries._array != (Entry *)0x0) {
      uVar12 = local_148._entries._capacity << 4;
      if (uVar12 == 0) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_148._entries._array;
      }
      else if (uVar12 < 0x11) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_148._entries._array;
      }
      else if (uVar12 < 0x19) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_148._entries._array;
      }
      else if (uVar12 < 0x21) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_148._entries._array;
      }
      else if (uVar12 < 0x31) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_148._entries._array;
      }
      else if (uVar12 < 0x41) {
        (local_148._entries._array)->_header = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (local_148._entries._array)->_weight = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_148._entries._array;
      }
      else {
        operator_delete(local_148._entries._array,0x10);
      }
    }
  }
  return pCVar17;
}

Assistant:

Clause* Condensation::simplify(Clause* cl)
{
  TIME_TRACE("condensation");

  unsigned clen=cl->length();
  if(clen<=1) {
    return cl;
  }
  unsigned newLen=clen-1;

  // stores newLen new literals
  static DArray<Literal*> newLits(32);
  //
  static DArray<LiteralList*> alts(32);

  LiteralMiniIndex cmi(cl);

  // For each pair of non-equal literals l1 and l2
  //
  CombinationIterator<unsigned> pairIt(0, clen);
  while(pairIt.hasNext()) {
    pair<unsigned,unsigned> lpair=pairIt.next();
    unsigned l1Index=lpair.first;
    unsigned l2Index=lpair.second;
    if(l1Index==l2Index) {
      continue;
    }
    Literal* l1=(*cl)[l1Index];
    Literal* l2=(*cl)[l2Index];

    newLits.ensure(newLen);

    RobSubstitution subst0;
    // For each unifying subst of l1 and l2
    // apply the subst to l1 and search for instances of this in the clause
    // (note that this is symmetric to applying subst to l2)
    SubstIterator sit=subst0.unifiers(l1,0,l2,0,false);
    while(sit.hasNext()) {
      RobSubstitution* subst=sit.next();
      alts.init(newLen,0);
      bool success=false;

      unsigned next=0;
      {
        Literal* lit=subst->apply(l1,0);
        newLits[next] = lit;
        // Use lit as a query to find instances of it in cmi (i.e. the clause)
        LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
        if(!iit.hasNext()) {
          // If there are no instances then finish
          goto match_fin;
        }
        // Store all instances in alts (alts[next] is a literal list)
        while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
        }
        next++;
      }

      // For all literals that are not l1 or l2
      // apply the subst and search for instances of the result as before
      for(unsigned i=0;i<clen;i++) {
        if(i!=l1Index && i!=l2Index) {
          Literal* lit=subst->apply((*cl)[i],0);
          newLits[next] = lit;
          LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
          if(!iit.hasNext()) {
            goto match_fin;
          }
          while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
          }
          next++;
        }
      }

      // I think this is asking if there is a substitution that will match
      // each lit in newLits with one of its instances in alts
      // CHECK!
      success=MLMatcher::canBeMatched(newLits.array(), newLen, cl,alts.array(),0,false);

    // We will jump here if we do not find a match, in this case success will be false
    match_fin:
      for(unsigned i=0;i<newLen;i++) {
        LiteralList::destroy(alts[i]);
      }

      if(success) {
        env.statistics->condensations++;
        return Clause::fromArray(newLits.begin(), newLen, SimplifyingInference1(InferenceRule::CONDENSATION, cl));
      }
    }
  }
  return cl;
}